

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

int ncnn::reduction_op<ncnn::reduction_op_sumsq<float>,std::plus<float>>
              (Mat *a,Mat *b,float v0,int dim,float coeff)

{
  bool bVar1;
  float *pfVar2;
  int in_EDX;
  Mat *in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  float fVar3;
  float in_XMM1_Da;
  int i_6;
  int i_5;
  float *ptr_4;
  int q_5;
  int j_3;
  int j_2;
  float *mins_ptr_1;
  int q_4;
  int j_1;
  int i_4;
  float *mins_ptr;
  float *ptr_3;
  int q_3;
  Mat mins;
  int j;
  float sum_3;
  int i_3;
  float *outptr;
  float *ptr_2;
  int q_2;
  int i_2;
  float sum_2;
  float *ptr_1;
  int q_1;
  int i_1;
  float sum;
  int i;
  float sum_1;
  float *ptr;
  int q;
  Mat sums;
  int size;
  int channels;
  int h;
  int w;
  plus<float> op2;
  reduction_op_sumsq<float> op;
  undefined4 in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcac;
  Mat *in_stack_fffffffffffffcb0;
  int in_stack_fffffffffffffcb8;
  float in_stack_fffffffffffffcbc;
  Mat *in_stack_fffffffffffffcc0;
  int local_2d0;
  int local_2cc;
  Mat local_2c8;
  Mat *local_298;
  int local_28c;
  int local_288;
  int local_284;
  Mat local_280;
  float *local_250;
  int local_244;
  int local_240;
  int local_23c;
  Mat local_238;
  float *local_208;
  Mat local_200;
  float *local_1d0;
  int local_1c4;
  int local_18c;
  float local_188;
  int local_184;
  Mat local_180;
  float *local_150;
  Mat local_148;
  float *local_118;
  int local_10c;
  int local_108;
  float local_104;
  Mat local_100;
  float *local_d0;
  int local_c8;
  int local_c4;
  float local_c0;
  int local_bc;
  float local_b8 [4];
  Mat local_a8;
  float *local_78;
  int local_70;
  int local_6c;
  Mat local_68;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  plus<float> local_26;
  reduction_op_sumsq<float> local_25;
  float local_24;
  int local_20;
  float local_1c;
  Mat *local_18;
  int local_4;
  
  local_2c = *(int *)(in_RDI + 0x1c);
  local_30 = *(int *)(in_RDI + 0x20);
  local_34 = *(int *)(in_RDI + 0x24);
  local_38 = local_2c * local_30;
  local_24 = in_XMM1_Da;
  local_20 = in_EDX;
  local_1c = in_XMM0_Da;
  local_18 = in_RSI;
  if (in_EDX == 0) {
    Mat::create(in_stack_fffffffffffffcc0,(int)in_stack_fffffffffffffcbc,
                (size_t)in_stack_fffffffffffffcb0);
  }
  else if (in_EDX == 1) {
    Mat::create(in_stack_fffffffffffffcc0,(int)in_stack_fffffffffffffcbc,
                (size_t)in_stack_fffffffffffffcb0);
  }
  else if (in_EDX == 2) {
    Mat::create(in_stack_fffffffffffffcc0,(int)in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8,
                (size_t)in_stack_fffffffffffffcb0);
  }
  else if (in_EDX == -1) {
    Mat::create(in_stack_fffffffffffffcc0,(int)in_stack_fffffffffffffcbc,
                (size_t)in_stack_fffffffffffffcb0);
  }
  else if (in_EDX == -2) {
    Mat::create(in_stack_fffffffffffffcc0,(int)in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8,
                (size_t)in_stack_fffffffffffffcb0);
  }
  bVar1 = Mat::empty(in_stack_fffffffffffffcb0);
  if (bVar1) {
    return -100;
  }
  if (local_20 == 0) {
    Mat::Mat(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,0x125817);
    bVar1 = Mat::empty(in_stack_fffffffffffffcb0);
    if (bVar1) {
      local_4 = -100;
      local_6c = 1;
    }
    else {
      for (local_70 = 0; local_70 < local_34; local_70 = local_70 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                     (int)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_a8);
        Mat::~Mat((Mat *)0x1258a4);
        local_b8[0] = local_1c;
        local_78 = pfVar2;
        for (local_bc = 0; fVar3 = local_b8[0], local_bc < local_38; local_bc = local_bc + 1) {
          local_b8[0] = reduction_op_sumsq<float>::operator()
                                  (&local_25,local_b8,local_78 + local_bc);
        }
        pfVar2 = Mat::operator[](&local_68,local_70);
        *pfVar2 = fVar3;
      }
      local_c0 = local_1c;
      for (local_c4 = 0; local_c4 < local_34; local_c4 = local_c4 + 1) {
        pfVar2 = Mat::operator[](&local_68,local_c4);
        local_c0 = std::plus<float>::operator()(&local_26,&local_c0,pfVar2);
      }
      fVar3 = local_c0 * local_24;
      pfVar2 = Mat::operator[](local_18,0);
      *pfVar2 = fVar3;
      local_6c = 0;
    }
    Mat::~Mat((Mat *)0x125a5b);
  }
  else {
    if (local_20 == 1) {
      for (local_c8 = 0; local_c8 < local_34; local_c8 = local_c8 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                     (int)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_100);
        Mat::~Mat((Mat *)0x125ada);
        local_104 = local_1c;
        local_d0 = pfVar2;
        for (local_108 = 0; local_108 < local_38; local_108 = local_108 + 1) {
          local_104 = reduction_op_sumsq<float>::operator()
                                (&local_25,&local_104,local_d0 + local_108);
        }
        fVar3 = local_104 * local_24;
        pfVar2 = Mat::operator[](local_18,local_c8);
        *pfVar2 = fVar3;
      }
      return 0;
    }
    if (local_20 == 2) {
      for (local_10c = 0; local_10c < local_34; local_10c = local_10c + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                     (int)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_148);
        Mat::~Mat((Mat *)0x125c14);
        local_118 = pfVar2;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                     (int)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_180);
        Mat::~Mat((Mat *)0x125c60);
        local_150 = pfVar2;
        for (local_184 = 0; local_184 < local_30; local_184 = local_184 + 1) {
          local_188 = local_1c;
          for (local_18c = 0; local_18c < local_2c; local_18c = local_18c + 1) {
            local_188 = reduction_op_sumsq<float>::operator()
                                  (&local_25,&local_188,local_118 + local_184);
          }
          local_150[local_184] = local_188 * local_24;
          local_118 = local_118 + local_2c;
        }
      }
      return 0;
    }
    if (local_20 != -1) {
      if (local_20 != -2) {
        return 0;
      }
      Mat::fill(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      for (local_28c = 0; local_28c < local_34; local_28c = local_28c + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                     (int)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
        in_stack_fffffffffffffcb0 = (Mat *)Mat::operator_cast_to_float_(&local_2c8);
        Mat::~Mat((Mat *)0x12624d);
        local_298 = in_stack_fffffffffffffcb0;
        for (local_2cc = 0; local_2cc < local_38; local_2cc = local_2cc + 1) {
          pfVar2 = Mat::operator[](local_18,local_2cc);
          fVar3 = reduction_op_sumsq<float>::operator()
                            (&local_25,pfVar2,
                             (float *)((long)&local_298->data + (long)local_2cc * 4));
          pfVar2 = Mat::operator[](local_18,local_2cc);
          *pfVar2 = fVar3;
        }
      }
      for (local_2d0 = 0; local_2d0 < local_38; local_2d0 = local_2d0 + 1) {
        fVar3 = local_24;
        pfVar2 = Mat::operator[](local_18,local_2d0);
        *pfVar2 = fVar3 * *pfVar2;
      }
      return 0;
    }
    Mat::Mat(in_stack_fffffffffffffcc0,(int)in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8,
             (int)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
             CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    bVar1 = Mat::empty(in_stack_fffffffffffffcb0);
    if (bVar1) {
      local_4 = -100;
      local_6c = 1;
    }
    else {
      Mat::fill(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      for (local_1c4 = 0; local_1c4 < local_34; local_1c4 = local_1c4 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                     (int)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_200);
        Mat::~Mat((Mat *)0x125e78);
        local_1d0 = pfVar2;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                     (int)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_238);
        Mat::~Mat((Mat *)0x125ec4);
        local_208 = pfVar2;
        for (local_23c = 0; local_23c < local_30; local_23c = local_23c + 1) {
          for (local_240 = 0; local_240 < local_2c; local_240 = local_240 + 1) {
            fVar3 = reduction_op_sumsq<float>::operator()
                              (&local_25,local_208 + local_240,local_1d0 + local_23c);
            local_208[local_240] = fVar3;
          }
          local_1d0 = local_1d0 + local_2c;
        }
      }
      Mat::fill(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      for (local_244 = 0; local_244 < local_34; local_244 = local_244 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                     (int)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_280);
        Mat::~Mat((Mat *)0x12607a);
        local_250 = pfVar2;
        for (local_284 = 0; local_284 < local_2c; local_284 = local_284 + 1) {
          pfVar2 = Mat::operator[](local_18,local_284);
          in_stack_fffffffffffffcbc =
               std::plus<float>::operator()(&local_26,pfVar2,local_250 + local_284);
          pfVar2 = Mat::operator[](local_18,local_284);
          *pfVar2 = in_stack_fffffffffffffcbc;
        }
      }
      for (local_288 = 0; local_288 < local_2c; local_288 = local_288 + 1) {
        fVar3 = local_24;
        pfVar2 = Mat::operator[](local_18,local_288);
        *pfVar2 = fVar3 * *pfVar2;
      }
      local_6c = 0;
    }
    Mat::~Mat((Mat *)0x1261a6);
  }
  if (local_6c == 0) {
    return 0;
  }
  return local_4;
}

Assistant:

static int reduction_op(const Mat& a, Mat& b, float v0, int dim, float coeff)
{
    Op op;
    Op2 op2;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    int size = w * h;

    if (dim == 0)
    {
        // w h c -> X X X
        b.create(1);
    }
    else if (dim == 1)
    {
        // w h c -> X X c
        b.create(channels);
    }
    else if (dim == 2)
    {
        // w h c -> X h c
        b.create(h, channels);
    }
    else if (dim == -1)
    {
        // w h c -> w X X
        b.create(w);
    }
    else if (dim == -2)
    {
        // w h c -> w h X
        b.create(w, h);
    }
    if (b.empty())
        return -100;

    if (dim == 0)
    {
        Mat sums(channels);
        if (sums.empty())
            return -100;

        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            float sum = v0;
            for (int i=0; i<size; i++)
            {
                sum = op(sum, ptr[i]);
            }

            sums[q] = sum;
        }

        float sum = v0;
        for (int i=0; i<channels; i++)
        {
            sum = op2(sum, sums[i]);
        }

        b[0] = sum * coeff;
    }
    else if (dim == 1)
    {
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            float sum = v0;
            for (int i=0; i<size; i++)
            {
                sum = op(sum, ptr[i]);
            }

            b[q] = sum * coeff;
        }
    }
    else if (dim == 2)
    {
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);
            float* outptr = b.channel(q);

            for (int i=0; i<h; i++)
            {
                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[i]);
                }

                outptr[i] = sum * coeff;

                ptr += w;
            }
        }
    }
    else if (dim == -1)
    {
        Mat mins(w, 1, channels);
        if (mins.empty())
            return -100;

        mins.fill(v0);

        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);
            float* mins_ptr = mins.channel(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    mins_ptr[j] = op(mins_ptr[j], ptr[i]);
                }

                ptr += w;
            }
        }

        b.fill(v0);

        for (int q=0; q<channels; q++)
        {
            const float* mins_ptr = mins.channel(q);
            for (int j=0; j<w; j++)
            {
                b[j] = op2(b[j], mins_ptr[j]);
            }
        }

        for (int j=0; j<w; j++)
        {
            b[j] *= coeff;
        }
    }
    else if (dim == -2)
    {
        b.fill(v0);

        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            for (int i=0; i<size; i++)
            {
                b[i] = op(b[i], ptr[i]);
            }
        }

        for (int i=0; i<size; i++)
        {
            b[i] *= coeff;
        }
    }

    return 0;
}